

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  mfb_update_state mVar2;
  mfb_window *pmVar3;
  mfb_window *window;
  mfb_window *window_high;
  mfb_window *window_low;
  mfb_window *in_stack_000000b8;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffffe8;
  int dimen;
  uint *in_stack_fffffffffffffff0;
  
  dimen = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  pretty_square(in_stack_fffffffffffffff0,dimen);
  pretty_square(in_stack_fffffffffffffff0,dimen);
  pmVar3 = mfb_open((char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  window = mfb_open((char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  while (uVar4 = window != (mfb_window *)0x0 || pmVar3 != (mfb_window *)0x0,
        window != (mfb_window *)0x0 || pmVar3 != (mfb_window *)0x0) {
    if ((pmVar3 != (mfb_window *)0x0) &&
       ((mVar2 = mfb_update_ex(window,(void *)CONCAT17(uVar4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
        mVar2 != STATE_OK || (_Var1 = mfb_wait_sync(in_stack_000000b8), !_Var1)))) {
      pmVar3 = (mfb_window *)0x0;
    }
    if ((window != (mfb_window *)0x0) &&
       ((mVar2 = mfb_update_ex(window,(void *)CONCAT17(uVar4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
        mVar2 != STATE_OK || (_Var1 = mfb_wait_sync(in_stack_000000b8), !_Var1)))) {
      window = (mfb_window *)0x0;
    }
  }
  return 0;
}

Assistant:

int 
main()
{
  pretty_square(g_buffer_low, DIMEN_LOW);
  pretty_square(g_buffer_high, DIMEN_HIGH);

  struct mfb_window *window_low = mfb_open("LowRes", DIMEN_LOW, DIMEN_LOW);
  struct mfb_window *window_high = mfb_open("HighRes", DIMEN_HIGH/2, DIMEN_HIGH/2);

  while (window_high || window_low)
    {
      if (window_low)
	if (mfb_update_ex(window_low, g_buffer_low, DIMEN_LOW, DIMEN_LOW) != STATE_OK
	      || !mfb_wait_sync(window_low))
	    window_low = NULL;

      if (window_high)
	if (mfb_update_ex(window_high, g_buffer_high, DIMEN_HIGH, DIMEN_HIGH) != STATE_OK
	    || !mfb_wait_sync(window_high))
	  window_high = NULL;
    }
  
  return 0;
}